

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.h
# Opt level: O2

unsigned_short __thiscall vm_meta_entry_t::xlat_prop(vm_meta_entry_t *this,vm_prop_id_t prop)

{
  ushort uVar1;
  undefined2 in_register_00000032;
  
  uVar1 = this->min_prop_;
  if ((uVar1 <= prop) &&
     ((ulong)CONCAT22(in_register_00000032,prop) < this->prop_xlat_cnt_ + (ulong)uVar1)) {
    return this->prop_xlat_[(ulong)CONCAT22(in_register_00000032,prop) - (ulong)uVar1];
  }
  return 0;
}

Assistant:

unsigned short xlat_prop(vm_prop_id_t prop) const
    {
        /*
         *   Check to see if the property is represented in the table.  If
         *   it's not within the range of properties in the table, there
         *   is no translation for the property.  
         */
        if (prop < min_prop_ || prop >= min_prop_ + prop_xlat_cnt_)
        {
            /* the property isn't in the table, so it has no translation */
            return 0;
        }
        
        /* return the function index from the table */
        return prop_xlat_[prop - min_prop_];
    }